

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall
xe::ContainerFormatParser::parseContainerValue(ContainerFormatParser *this,string *dst,int *offset)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_40;
  int local_3c;
  bool isEnd;
  int curChar;
  int quotChar;
  bool isString;
  int *offset_local;
  string *dst_local;
  ContainerFormatParser *this_local;
  
  iVar1 = getChar(this,*offset);
  bVar2 = true;
  if (iVar1 != 0x22) {
    iVar1 = getChar(this,*offset);
    bVar2 = iVar1 == 0x27;
  }
  if (bVar2) {
    local_3c = getChar(this,*offset);
    *offset = *offset + 1;
  }
  else {
    local_3c = 0;
  }
  std::__cxx11::string::clear();
  while( true ) {
    if (*offset < this->m_elementLen) {
      local_40 = getChar(this,*offset);
    }
    else {
      local_40 = 0;
    }
    bVar3 = true;
    if ((local_40 != 0) && (bVar3 = true, local_40 != -1)) {
      if (bVar2) {
        bVar3 = local_40 == local_3c;
      }
      else {
        bVar3 = true;
        if ((local_40 != 0x20) && (bVar3 = true, local_40 != 10)) {
          bVar3 = local_40 == 0xd;
        }
      }
    }
    if (bVar3) break;
    std::__cxx11::string::push_back((char)dst);
    *offset = *offset + 1;
  }
  if ((bVar2) && (iVar1 = getChar(this,*offset), iVar1 == local_3c)) {
    *offset = *offset + 1;
  }
  return;
}

Assistant:

void ContainerFormatParser::parseContainerValue (std::string& dst, int& offset) const
{
	DE_ASSERT(offset < m_elementLen);

	bool	isString	= getChar(offset) == '"' || getChar(offset) == '\'';
	int		quotChar	= isString ? getChar(offset) : 0;

	if (isString)
		offset += 1;

	dst.clear();

	for (;;)
	{
		int		curChar		= offset < m_elementLen ? getChar(offset) : 0;
		bool	isEnd		= curChar == 0 || curChar == (int)END_OF_BUFFER ||
							  (isString ? (curChar == quotChar) : (curChar == ' ' || curChar == '\n' || curChar == '\r'));

		if (isEnd)
			break;
		else
		{
			// \todo [2012-06-09 pyry] Escapes.
			dst.push_back((char)curChar);
		}

		offset += 1;
	}

	if (isString && getChar(offset) == quotChar)
		offset += 1;
}